

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_hv_accept.cpp
# Opt level: O1

int __thiscall ir_return::accept(ir_return *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  ir_rvalue *piVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000034;
  long *plVar4;
  
  plVar4 = (long *)CONCAT44(in_register_00000034,__fd);
  iVar2 = (**(code **)(*plVar4 + 0xe0))(plVar4,this);
  if (iVar2 != 0) {
LAB_001e7395:
    iVar3 = 0;
    if (iVar2 != 1) {
      iVar3 = iVar2;
    }
    return iVar3;
  }
  piVar1 = this->value;
  if (piVar1 != (ir_rvalue *)0x0) {
    iVar2 = (*(piVar1->super_ir_instruction)._vptr_ir_instruction[3])(piVar1,plVar4);
    if (iVar2 != 0) goto LAB_001e7395;
  }
  iVar2 = (**(code **)(*plVar4 + 0xe8))(plVar4,this);
  return iVar2;
}

Assistant:

ir_visitor_status
ir_return::accept(ir_hierarchical_visitor *v)
{
   ir_visitor_status s = v->visit_enter(this);
   if (s != visit_continue)
      return (s == visit_continue_with_parent) ? visit_continue : s;

   ir_rvalue *val = this->get_value();
   if (val) {
      s = val->accept(v);
      if (s != visit_continue)
	 return (s == visit_continue_with_parent) ? visit_continue : s;
   }

   return v->visit_leave(this);
}